

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_base(lysp_yin_ctx *ctx,ly_stmt parent_stmt,void *dest,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  
  if (parent_stmt == LY_STMT_IDENTITY) {
    LVar1 = yin_parse_simple_elements
                      (ctx,LY_STMT_BASE,(char ***)dest,YIN_ARG_NAME,Y_PREF_IDENTIF_ARG,exts);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
  }
  else {
    if (parent_stmt != LY_STMT_TYPE) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c",
             900);
      return LY_EINT;
    }
    LVar1 = yin_parse_simple_elements
                      (ctx,LY_STMT_BASE,(char ***)((long)dest + 0x38),YIN_ARG_NAME,
                       Y_PREF_IDENTIF_ARG,exts);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    *(byte *)((long)dest + 0x62) = *(byte *)((long)dest + 0x62) | 1;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
yin_parse_base(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, void *dest, struct lysp_ext_instance **exts)
{
    struct lysp_type *type;

    if (parent_stmt == LY_STMT_TYPE) {
        type = (struct lysp_type *)dest;
        LY_CHECK_RET(yin_parse_simple_elements(ctx, LY_STMT_BASE, &type->bases, YIN_ARG_NAME, Y_PREF_IDENTIF_ARG, exts));
        type->flags |= LYS_SET_BASE;
    } else if (parent_stmt == LY_STMT_IDENTITY) {
        LY_CHECK_RET(yin_parse_simple_elements(ctx, LY_STMT_BASE, (const char ***)dest, YIN_ARG_NAME, Y_PREF_IDENTIF_ARG, exts));
    } else {
        LOGINT(ctx->xmlctx->ctx);
        return LY_EINT;
    }

    return LY_SUCCESS;
}